

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

void __thiscall
duckdb::ParquetReader::PrepareRowGroupBuffer
          (ParquetReader *this,ParquetReaderScanState *state,idx_t i)

{
  unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> *this_00;
  ParquetColumnSchemaType PVar1;
  idx_t child_idx;
  _Base_ptr p_Var2;
  ulong __n;
  FilterPropagateResult FVar3;
  int iVar4;
  ParquetRowGroup *pPVar5;
  reference pvVar6;
  pointer pCVar7;
  StructColumnReader *this_01;
  ColumnReader *reader;
  reference pvVar8;
  pointer pTVar9;
  _Base_ptr p_Var10;
  type filter;
  const_reference pvVar11;
  type pBVar12;
  uint uVar13;
  _Base_ptr p_Var14;
  bool bVar15;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> stats;
  LogicalTypeId local_49;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_48;
  ParquetColumnSchema *local_40;
  ParquetReader *local_38;
  
  pPVar5 = GetGroup(this,state);
  pvVar6 = vector<duckdb::MultiFileLocalColumnId,_true>::operator[]
                     (&(this->super_BaseFileReader).column_ids.column_ids,i);
  child_idx = pvVar6->column_id;
  local_38 = (ParquetReader *)&state->root_reader;
  pCVar7 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)local_38);
  this_01 = ColumnReader::Cast<duckdb::StructColumnReader>(pCVar7);
  reader = StructColumnReader::GetChildReader(this_01,child_idx);
  if ((this->super_BaseFileReader).filters.
      super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
      .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl == (TableFilterSet *)0x0)
  goto LAB_01b867c8;
  this_00 = &(this->super_BaseFileReader).filters;
  pvVar8 = vector<unsigned_long,_true>::operator[](&state->group_idx_list,state->current_group);
  local_40 = (ParquetColumnSchema *)&pPVar5->columns;
  ColumnReader::Stats((ColumnReader *)&stack0xffffffffffffffb8,(idx_t)reader,
                      (vector<duckdb_parquet::ColumnChunk,_true> *)*pvVar8);
  pTVar9 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::
           operator->(this_00);
  p_Var14 = &(pTVar9->filters)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var10 = p_Var14;
  for (p_Var2 = (pTVar9->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < i]) {
    if (*(ulong *)(p_Var2 + 1) >= i) {
      p_Var10 = p_Var2;
    }
  }
  if ((p_Var10 != p_Var14) && (*(ulong *)(p_Var10 + 1) <= i)) {
    p_Var14 = p_Var10;
  }
  if ((local_48._M_head_impl != (BaseStatistics *)0x0) &&
     (pTVar9 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
               ::operator->(this_00),
     (_Rb_tree_header *)p_Var14 != &(pTVar9->filters)._M_t._M_impl.super__Rb_tree_header)) {
    filter = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator*((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                        *)&p_Var14[1]._M_parent);
    __n = reader->column_schema->column_index;
    PVar1 = reader->column_schema->schema_type;
    bVar15 = true;
    if ((__n < (ulong)(((long)(pPVar5->columns).
                              super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                              .
                              super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pPVar5->columns).
                              super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                              .
                              super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 7) * -0x3333333333333333)
        ) && (pvVar11 = vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                                  ((vector<duckdb_parquet::ColumnChunk,_true> *)local_40,__n),
             ((byte)(pvVar11->meta_data).statistics.__isset & 0x20) != 0)) {
      pvVar11 = vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                          ((vector<duckdb_parquet::ColumnChunk,_true> *)local_40,
                           reader->column_schema->column_index);
      bVar15 = ((byte)(pvVar11->meta_data).statistics.__isset & 0x10) == 0;
    }
    if (PVar1 == EXPRESSION) {
      FVar3 = NO_PRUNING_POSSIBLE;
    }
    else if (bVar15) {
LAB_01b866b8:
      pBVar12 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                             *)&stack0xffffffffffffffb8);
      iVar4 = (*filter->_vptr_TableFilter[2])(filter,pBVar12);
      FVar3 = (FilterPropagateResult)iVar4;
    }
    else if ((reader->column_schema->type).id_ == VARCHAR) {
      pBVar12 = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                ::operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                             *)&stack0xffffffffffffffb8);
      pvVar11 = vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                          ((vector<duckdb_parquet::ColumnChunk,_true> *)local_40,
                           reader->column_schema->column_index);
      FVar3 = CheckParquetStringFilter(pBVar12,&(pvVar11->meta_data).statistics,filter);
    }
    else {
      if ((bVar15) || (((reader->column_schema->type).id_ & ~SQLNULL) != FLOAT)) goto LAB_01b866b8;
      pvVar11 = vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                          ((vector<duckdb_parquet::ColumnChunk,_true> *)local_40,
                           reader->column_schema->column_index);
      FVar3 = CheckParquetFloatFilter(reader,&(pvVar11->meta_data).statistics,filter);
    }
    if (FVar3 == NO_PRUNING_POSSIBLE) {
      uVar13 = (uint)(reader->column_schema->type).physical_type_;
      if (((uVar13 < 0x1e) && ((0x21800000U >> (uVar13 & 0x1f) & 1) != 0)) || (PVar1 != COLUMN))
      goto LAB_01b8677f;
      local_49 = (reader->column_schema->type).id_;
      bVar15 = ParquetStatisticsUtils::BloomFilterSupported(&local_49);
      if (!bVar15) goto LAB_01b8677f;
      pvVar11 = vector<duckdb_parquet::ColumnChunk,_true>::operator[]
                          ((vector<duckdb_parquet::ColumnChunk,_true> *)local_40,
                           reader->column_schema->column_index);
      bVar15 = ParquetStatisticsUtils::BloomFilterExcludes
                         (filter,&pvVar11->meta_data,
                          (state->thrift_file_proto)._M_t.
                          super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
                          .
                          super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>
                          ._M_head_impl,this->allocator);
    }
    else {
LAB_01b8677f:
      bVar15 = FVar3 == FILTER_ALWAYS_FALSE;
    }
    if (bVar15 != false) {
      state->offset_in_group = pPVar5->num_rows;
      if (local_48._M_head_impl == (BaseStatistics *)0x0) {
        return;
      }
      BaseStatistics::~BaseStatistics(local_48._M_head_impl);
      operator_delete(local_48._M_head_impl);
      return;
    }
  }
  if ((tuple<duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
      local_48._M_head_impl != (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)0x0) {
    BaseStatistics::~BaseStatistics(local_48._M_head_impl);
    operator_delete(local_48._M_head_impl);
  }
LAB_01b867c8:
  pCVar7 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->((unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
                       *)local_38);
  pvVar8 = vector<unsigned_long,_true>::operator[](&state->group_idx_list,state->current_group);
  (*pCVar7->_vptr_ColumnReader[2])
            (pCVar7,*pvVar8,&pPVar5->columns,
             (state->thrift_file_proto)._M_t.
             super___uniq_ptr_impl<duckdb_apache::thrift::protocol::TProtocol,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_std::default_delete<duckdb_apache::thrift::protocol::TProtocol>_>
             .super__Head_base<0UL,_duckdb_apache::thrift::protocol::TProtocol_*,_false>.
             _M_head_impl);
  return;
}

Assistant:

void ParquetReader::PrepareRowGroupBuffer(ParquetReaderScanState &state, idx_t i) {
	auto &group = GetGroup(state);
	auto col_idx = MultiFileLocalIndex(i);
	auto column_id = column_ids[col_idx];
	auto &column_reader = state.root_reader->Cast<StructColumnReader>().GetChildReader(column_id);

	if (filters) {
		auto stats = column_reader.Stats(state.group_idx_list[state.current_group], group.columns);
		// filters contain output chunk index, not file col idx!
		auto filter_entry = filters->filters.find(col_idx);
		if (stats && filter_entry != filters->filters.end()) {
			auto &filter = *filter_entry->second;

			FilterPropagateResult prune_result;
			bool is_generated_column = column_reader.ColumnIndex() >= group.columns.size();
			bool is_column = column_reader.Schema().schema_type == ParquetColumnSchemaType::COLUMN;
			bool is_expression = column_reader.Schema().schema_type == ParquetColumnSchemaType::EXPRESSION;
			bool has_min_max = false;
			if (!is_generated_column) {
				has_min_max = group.columns[column_reader.ColumnIndex()].meta_data.statistics.__isset.min_value &&
				              group.columns[column_reader.ColumnIndex()].meta_data.statistics.__isset.max_value;
			}
			if (is_expression) {
				// no pruning possible for expressions
				prune_result = FilterPropagateResult::NO_PRUNING_POSSIBLE;
			} else if (!is_generated_column && has_min_max && column_reader.Type().id() == LogicalTypeId::VARCHAR) {
				// our StringStats only store the first 8 bytes of strings (even if Parquet has longer string stats)
				// however, when reading remote Parquet files, skipping row groups is really important
				// here, we implement a special case to check the full length for string filters
				prune_result = CheckParquetStringFilter(
				    *stats, group.columns[column_reader.ColumnIndex()].meta_data.statistics, filter);
			} else if (!is_generated_column && has_min_max &&
			           (column_reader.Type().id() == LogicalTypeId::FLOAT ||
			            column_reader.Type().id() == LogicalTypeId::DOUBLE)) {
				// floating point columns can have NaN values in addition to the min/max bounds defined in the file
				// in order to do optimal pruning - we prune based on the [min, max] of the file followed by pruning
				// based on nan
				prune_result = CheckParquetFloatFilter(
				    column_reader, group.columns[column_reader.ColumnIndex()].meta_data.statistics, filter);
			} else {
				prune_result = filter.CheckStatistics(*stats);
			}
			// check the bloom filter if present
			if (prune_result == FilterPropagateResult::NO_PRUNING_POSSIBLE && !column_reader.Type().IsNested() &&
			    is_column && ParquetStatisticsUtils::BloomFilterSupported(column_reader.Type().id()) &&
			    ParquetStatisticsUtils::BloomFilterExcludes(filter,
			                                                group.columns[column_reader.ColumnIndex()].meta_data,
			                                                *state.thrift_file_proto, allocator)) {
				prune_result = FilterPropagateResult::FILTER_ALWAYS_FALSE;
			}

			if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
				// this effectively will skip this chunk
				state.offset_in_group = group.num_rows;
				return;
			}
		}
	}

	state.root_reader->InitializeRead(state.group_idx_list[state.current_group], group.columns,
	                                  *state.thrift_file_proto);
}